

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

void __thiscall ninx::lexer::token::Text::Text(Text *this,int line_number,string *text)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  bool bVar2;
  int iVar3;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_78;
  
  (this->super_Token).line_number = line_number;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Text_0014f3f8;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + text->_M_string_length);
  this->valid_newline = false;
  if (Text(int,std::__cxx11::string_const&)::multiple_newline_validation == '\0') {
    iVar3 = __cxa_guard_acquire(&Text(int,std::__cxx11::string_const&)::multiple_newline_validation)
    ;
    if (iVar3 != 0) {
      boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
      basic_regex(&Text::multiple_newline_validation,"\\s*[\\n]{2,}\\s*",0);
      __cxa_atexit(boost::
                   basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                   ~basic_regex,&Text::multiple_newline_validation,&__dso_handle);
      __cxa_guard_release(&Text(int,std::__cxx11::string_const&)::multiple_newline_validation);
    }
  }
  local_78.m_null.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)0x0;
  local_78.m_null.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = (char *)0x0;
  local_78.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_base._M_current = (char *)0x0;
  local_78.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_null.matched = false;
  local_78.m_named_subs.px = (element_type *)0x0;
  local_78.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
  local_78.m_last_closed_paren = 0;
  local_78.m_is_singular = true;
  first._M_current = (this->text)._M_dataplus._M_p;
  bVar2 = boost::
          regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                    (first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(first._M_current + (this->text)._M_string_length),&local_78,
                     &Text::multiple_newline_validation,match_any);
  boost::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results(&local_78);
  if (bVar2) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->text,0,(char *)(this->text)._M_string_length,0x1375af);
    this->valid_newline = true;
  }
  return;
}

Assistant:

ninx::lexer::token::Text::Text(int line_number, const std::string &text) : Token(line_number), text(text) {
    // Check if there are multiple spaces
    static const boost::regex multiple_newline_validation("\\s*[\\n]{2,}\\s*");
    if (regex_match(this->text, multiple_newline_validation)) {
        this->text = "\n";
        valid_newline = true;
    }
}